

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::WriteBin
          (BamStandardIndex *this,uint32_t *binId,BaiAlignmentChunkVector *chunks)

{
  undefined8 uVar1;
  uint32_t *in_RSI;
  long in_RDI;
  BaiAlignmentChunkVector *in_stack_00000008;
  BamStandardIndex *in_stack_00000010;
  int64_t numBytesWritten;
  uint32_t binKey;
  allocator local_81;
  string local_80 [16];
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  BamException *in_stack_ffffffffffffffa0;
  allocator local_49;
  string local_48 [32];
  long local_28;
  uint32_t local_1c [7];
  
  local_1c[0] = *in_RSI;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32(local_1c);
  }
  local_28 = (**(code **)(**(long **)(in_RDI + 0x58) + 0x40))(*(long **)(in_RDI + 0x58),local_1c,4);
  if (local_28 != 4) {
    uVar1 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"BamStandardIndex::WriteBin",&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"could not write bin ID",&local_81);
    BamException::BamException
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    __cxa_throw(uVar1,&BamException::typeinfo,BamException::~BamException);
  }
  WriteAlignmentChunks(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void BamStandardIndex::WriteBin(const uint32_t& binId, BaiAlignmentChunkVector& chunks)
{

    // write BAM bin ID
    uint32_t binKey = binId;
    if (m_isBigEndian) SwapEndian_32(binKey);
    const int64_t numBytesWritten = m_resources.Device->Write((const char*)&binKey, sizeof(binKey));
    if (numBytesWritten != sizeof(binKey))
        throw BamException("BamStandardIndex::WriteBin", "could not write bin ID");

    // write bin's alignment chunks
    WriteAlignmentChunks(chunks);
}